

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O2

vector<unsigned_short,_std::allocator<unsigned_short>_> * __thiscall
KmerCounter::get_count_by_name(KmerCounter *this,string *name)

{
  pointer pbVar1;
  long lVar2;
  __type _Var3;
  runtime_error *this_00;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar5 = 0xffffffffffffffff;
  lVar6 = 0;
  lVar2 = -0x18;
  do {
    lVar4 = lVar2;
    pbVar1 = (this->count_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = uVar5 + 1;
    if ((ulong)((long)(this->count_names).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"Couldn\'t find a count named: ",name);
      std::runtime_error::runtime_error(this_00,(string *)&local_50);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(pbVar1->_M_dataplus)._M_p + lVar6);
    lVar6 = lVar6 + 0x20;
    _Var3 = std::operator==(__lhs,name);
    lVar2 = lVar4 + 0x18;
  } while (!_Var3);
  return (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
         ((long)&(this->counts).
                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data + lVar4);
}

Assistant:

const std::vector<uint16_t> &KmerCounter::get_count_by_name(const std::string &name) const {
    for (int i = 0; i < count_names.size(); i++) {
        if (count_names[i] == name) {
            return counts[i];
        }
    }

    throw std::runtime_error("Couldn't find a count named: "+name);
}